

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.hpp
# Opt level: O2

bool __thiscall
ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::getRequestBuffer
          (ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  uint8_t data;
  
  data = '\f';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,9);
  ProtocolBase::generateBuffer
            (&this->super_ProtocolBase,
             (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start,&data,1);
  return true;
}

Assistant:

bool getRequestBuffer(std::vector<uint8_t> &buffer) {
        uint8_t data = sizeof(Rx) * num ; //读取的话数据部分为需要读取的长度
        buffer.resize(9);
        generateBuffer(&buffer[0], &data, 1);
        return true;
    }